

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

void compute_color(j_decompress_ptr cinfo,boxptr boxp,int icolor)

{
  ulong uVar1;
  long lVar2;
  long c2total;
  long c1total;
  long c0total;
  long total;
  long count;
  int c2max;
  int c2min;
  int c1max;
  int c1min;
  int c0max;
  int c0min;
  int c2;
  int c1;
  int c0;
  histptr histp;
  hist3d histogram;
  my_cquantize_ptr_conflict cquantize;
  int icolor_local;
  boxptr boxp_local;
  j_decompress_ptr cinfo_local;
  
  total = 0;
  c0total = 0;
  c1total = 0;
  c2total = 0;
  for (c0 = boxp->c0min; c1 = boxp->c1min, c0 <= boxp->c0max; c0 = c0 + 1) {
    for (; c1 <= boxp->c1max; c1 = c1 + 1) {
      histp = (histptr)(*(long *)(cinfo->cquantize[1].finish_pass + (long)c0 * 8) + (long)c1 * 0x40
                       + (long)boxp->c2min * 2);
      for (c2 = boxp->c2min; c2 <= boxp->c2max; c2 = c2 + 1) {
        uVar1 = (ulong)*histp;
        if (uVar1 != 0) {
          total = uVar1 + total;
          c0total = (long)(c0 * 8 + 4) * uVar1 + c0total;
          c1total = (long)(c1 * 4 + 2) * uVar1 + c1total;
          c2total = (long)(c2 * 8 + 4) * uVar1 + c2total;
        }
        histp = histp + 1;
      }
    }
  }
  lVar2 = total >> 1;
  (*cinfo->colormap)[icolor] = (JSAMPLE)((c0total + lVar2) / total);
  cinfo->colormap[1][icolor] = (JSAMPLE)((c1total + lVar2) / total);
  cinfo->colormap[2][icolor] = (JSAMPLE)((c2total + lVar2) / total);
  return;
}

Assistant:

LOCAL(void)
compute_color(j_decompress_ptr cinfo, boxptr boxp, int icolor)
/* Compute representative color for a box, put it in colormap[icolor] */
{
  /* Current algorithm: mean weighted by pixels (not colors) */
  /* Note it is important to get the rounding correct! */
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  histptr histp;
  int c0, c1, c2;
  int c0min, c0max, c1min, c1max, c2min, c2max;
  long count;
  long total = 0;
  long c0total = 0;
  long c1total = 0;
  long c2total = 0;

  c0min = boxp->c0min;  c0max = boxp->c0max;
  c1min = boxp->c1min;  c1max = boxp->c1max;
  c2min = boxp->c2min;  c2max = boxp->c2max;

  for (c0 = c0min; c0 <= c0max; c0++)
    for (c1 = c1min; c1 <= c1max; c1++) {
      histp = &histogram[c0][c1][c2min];
      for (c2 = c2min; c2 <= c2max; c2++) {
        if ((count = *histp++) != 0) {
          total += count;
          c0total += ((c0 << C0_SHIFT) + ((1 << C0_SHIFT) >> 1)) * count;
          c1total += ((c1 << C1_SHIFT) + ((1 << C1_SHIFT) >> 1)) * count;
          c2total += ((c2 << C2_SHIFT) + ((1 << C2_SHIFT) >> 1)) * count;
        }
      }
    }

  cinfo->colormap[0][icolor] = (JSAMPLE)((c0total + (total >> 1)) / total);
  cinfo->colormap[1][icolor] = (JSAMPLE)((c1total + (total >> 1)) / total);
  cinfo->colormap[2][icolor] = (JSAMPLE)((c2total + (total >> 1)) / total);
}